

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

double calc_mean_only_weighted<float,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                 long *Xc_indptr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  size_t *psVar1;
  ulong *puVar2;
  long lVar3;
  long *plVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong *puVar13;
  long *plVar14;
  size_t row;
  ulong *key;
  longdouble lVar15;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar16;
  tuple<> local_a1;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_a0;
  longdouble local_98;
  long local_88;
  long *local_80;
  ulong *local_78;
  longdouble local_70;
  longdouble local_64;
  double local_58;
  size_t *local_50;
  long local_48;
  ulong local_40;
  
  lVar3 = Xc_indptr[col_num];
  local_88 = Xc_indptr[col_num + 1];
  local_58 = 0.0;
  if (lVar3 != local_88) {
    local_98 = (longdouble)CONCAT28(local_98._8_2_,lVar3);
    local_70 = (longdouble)CONCAT28(local_70._8_2_,Xc);
    puVar13 = ix_arr + st;
    local_78 = ix_arr + end + 1;
    uVar6 = (long)local_78 - (long)puVar13 >> 3;
    key = puVar13;
    if (0 < (long)uVar6) {
      do {
        uVar7 = uVar6 >> 1;
        uVar10 = ~uVar7 + uVar6;
        uVar6 = uVar7;
        if (key[uVar7] < (ulong)Xc_ind[lVar3]) {
          key = key + uVar7 + 1;
          uVar6 = uVar10;
        }
      } while (0 < (long)uVar6);
    }
    local_40 = Xc_ind[local_88 + -1];
    local_64 = (longdouble)0;
    local_80 = Xc_ind;
    local_50 = ix_arr;
    pfVar5 = Xc;
    if (st <= end) {
      local_64 = (longdouble)0;
      do {
        local_a0._M_head_impl = puVar13;
        pVar16 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,puVar13,(piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_a0,&local_a1);
        local_64 = local_64 + (longdouble)*(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8)
        ;
        st = st + 1;
        puVar13 = puVar13 + 1;
        pfVar5 = local_70._0_8_;
        lVar3 = local_98._0_8_;
      } while (st <= end);
    }
    local_98._0_8_ = lVar3;
    local_70._0_8_ = pfVar5;
    pfVar5 = local_70._0_8_;
    plVar4 = local_80;
    lVar3 = local_88;
    if (key != local_78) {
      local_48 = local_88 + -1;
      psVar1 = local_50 + end;
      local_70 = (longdouble)0;
      lVar9 = local_98._0_8_;
      lVar12 = local_88;
      puVar13 = local_78;
      plVar14 = local_80;
      local_98 = local_70;
      while (uVar6 = *key, uVar6 <= local_40) {
        puVar2 = (ulong *)(plVar14 + lVar9);
        uVar7 = *puVar2;
        if (uVar7 == uVar6) {
          local_a0._M_head_impl = key;
          if ((uint)ABS(pfVar5[lVar9]) < 0x7f800000) {
            pVar16 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a0,&local_a1);
            lVar15 = (longdouble)*(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8);
            local_70 = local_70 + lVar15;
            local_98 = local_98 + (((longdouble)pfVar5[lVar9] - local_98) * lVar15) / local_70;
          }
          else {
            pVar16 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a0,&local_a1);
            local_64 = local_64 -
                       (longdouble)*(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8);
          }
          if ((key == psVar1) || (lVar9 == local_48)) break;
          puVar8 = puVar2 + 1;
          key = key + 1;
          uVar6 = (long)plVar4 + (lVar3 * 8 - (long)puVar8) >> 3;
          lVar12 = local_88;
          puVar13 = local_78;
          plVar14 = local_80;
          if (0 < (long)uVar6) {
            do {
              uVar7 = uVar6 >> 1;
              uVar10 = ~uVar7 + uVar6;
              uVar6 = uVar7;
              if ((puVar8 + uVar7 + 1)[-1] < *key) {
                puVar8 = puVar8 + uVar7 + 1;
                uVar6 = uVar10;
              }
            } while (0 < (long)uVar6);
          }
LAB_002d0fd8:
          lVar9 = (long)puVar8 - (long)plVar14 >> 3;
        }
        else {
          if ((long)uVar7 <= (long)uVar6) {
            puVar8 = puVar2 + 1;
            uVar7 = (long)plVar4 + (lVar3 * 8 - (long)(puVar2 + 1)) >> 3;
            while (0 < (long)uVar7) {
              uVar10 = uVar7 >> 1;
              uVar11 = ~uVar10 + uVar7;
              uVar7 = uVar10;
              if ((puVar8 + uVar10 + 1)[-1] < uVar6) {
                puVar8 = puVar8 + uVar10 + 1;
                uVar7 = uVar11;
              }
            }
            goto LAB_002d0fd8;
          }
          key = key + 1;
          uVar6 = (long)puVar13 - (long)key >> 3;
          while (0 < (long)uVar6) {
            uVar10 = uVar6 >> 1;
            uVar11 = ~uVar10 + uVar6;
            uVar6 = uVar10;
            if (key[uVar10] < uVar7) {
              key = key + uVar10 + 1;
              uVar6 = uVar11;
            }
          }
        }
        if ((key == puVar13) || (lVar9 == lVar12)) break;
      }
      if ((local_70 != (longdouble)0) || (NAN(local_70) || NAN((longdouble)0))) {
        if (local_70 < local_64) {
          local_98 = local_98 * (local_70 / local_64);
        }
        local_58 = (double)local_98;
      }
    }
  }
  return local_58;
}

Assistant:

double calc_mean_only_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return 0;
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos]))) {
                cnt -= w[*row];
            }

            else {
                w_this = w[*row];
                added += w_this;
                m += w_this * (Xc[curr_pos] - m) / added;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
        return 0;

    if (cnt > added)
        m *= (ldouble_safe)added / (ldouble_safe)cnt;

    return m;
}